

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineColorWriteCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineColorWriteCreateInfoEXT>
          (Impl *this,VkPipelineColorWriteCreateInfoEXT *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineColorWriteCreateInfoEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineColorWriteCreateInfoEXT>(alloc,count);
    if (pVVar1 != (VkPipelineColorWriteCreateInfoEXT *)0x0) {
      pVVar1 = (VkPipelineColorWriteCreateInfoEXT *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkPipelineColorWriteCreateInfoEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}